

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v10::detail::
    get_dynamic_spec<fmt::v10::detail::width_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
              (basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> custom;
  detail *this;
  undefined6 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> bVar4;
  int value_04;
  type tVar5;
  byte bStack0000000000000008;
  undefined4 in_stack_0000000c;
  unkbyte10 in_stack_fffffffffffffee8;
  undefined6 in_stack_fffffffffffffef2;
  width_checker local_c9;
  ulong local_c8;
  unsigned_long_long value;
  detail *local_b0;
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> local_a8;
  basic_string_view<char> local_98;
  unsigned___int128 *local_88;
  unsigned___int128 *local_78;
  detail *local_60;
  __int128 *local_58;
  __int128 *local_48;
  detail *local_30;
  undefined4 *local_20;
  width_checker *local_18;
  ulong local_10;
  
  local_20 = (undefined4 *)&stack0x00000008;
  this = arg.value_.field_0._0_8_;
  local_18 = &local_c9;
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 0:
  default:
    monostate::monostate((monostate *)((long)&value + 7));
    bVar4 = arg;
    uVar1 = arg.value_.field_0.long_long_value._2_6_;
    uVar2 = arg.value_.field_0.int128_value._8_4_;
    arg = bVar4;
    bVar4 = arg;
    arg.value_.field_0.long_long_value._2_6_ = uVar1;
    arg.value_.field_0.int128_value._8_4_ = uVar2;
    local_10 = width_checker::operator()<fmt::v10::monostate,_0>(&local_c9);
    bVar4 = arg;
    break;
  case 1:
    local_10 = width_checker::operator()<int,_0>(&local_c9,(int)_bStack0000000000000008);
    bVar4 = arg;
    break;
  case 2:
    local_10 = width_checker::operator()<unsigned_int,_0>(&local_c9,(uint)_bStack0000000000000008);
    bVar4 = arg;
    break;
  case 3:
    local_10 = width_checker::operator()<long_long,_0>
                         (&local_c9,CONCAT44(in_stack_0000000c,_bStack0000000000000008));
    bVar4 = arg;
    break;
  case 4:
    local_10 = width_checker::operator()<unsigned_long_long,_0>
                         (&local_c9,CONCAT44(in_stack_0000000c,_bStack0000000000000008));
    bVar4 = arg;
    break;
  case 5:
    value_00._10_6_ = in_stack_fffffffffffffef2;
    value_00._0_10_ = in_stack_fffffffffffffee8;
    local_30 = this;
    local_58 = convert_for_visit<__int128>
                         ((__int128 *)CONCAT44(in_stack_0000000c,_bStack0000000000000008),
                          (__int128)value_00);
    bVar4 = arg;
    value_01._10_6_ = in_stack_fffffffffffffef2;
    value_01._0_10_ = in_stack_fffffffffffffee8;
    uVar1 = arg.value_.field_0.long_long_value._2_6_;
    uVar2 = arg.value_.field_0.int128_value._8_4_;
    arg = bVar4;
    local_48 = local_58;
    bVar4 = arg;
    arg.value_.field_0.long_long_value._2_6_ = uVar1;
    arg.value_.field_0.int128_value._8_4_ = uVar2;
    local_10 = width_checker::operator()<__int128,_0>(&local_c9,(__int128)value_01);
    bVar4 = arg;
    break;
  case 6:
    value_02._10_6_ = in_stack_fffffffffffffef2;
    value_02._0_10_ = in_stack_fffffffffffffee8;
    local_60 = this;
    local_88 = convert_for_visit<unsigned__int128>
                         ((unsigned___int128 *)CONCAT44(in_stack_0000000c,_bStack0000000000000008),
                          this,(unsigned___int128)value_02);
    bVar4 = arg;
    value_03._10_6_ = in_stack_fffffffffffffef2;
    value_03._0_10_ = in_stack_fffffffffffffee8;
    uVar1 = arg.value_.field_0.long_long_value._2_6_;
    uVar2 = arg.value_.field_0.int128_value._8_4_;
    arg = bVar4;
    local_78 = local_88;
    bVar4 = arg;
    arg.value_.field_0.long_long_value._2_6_ = uVar1;
    arg.value_.field_0.int128_value._8_4_ = uVar2;
    local_10 = width_checker::operator()<unsigned___int128,_0>
                         (&local_c9,(unsigned___int128)value_03);
    bVar4 = arg;
    break;
  case 7:
    local_10 = width_checker::operator()<bool,_0>(&local_c9,(bool)(bStack0000000000000008 & 1));
    bVar4 = arg;
    break;
  case 8:
    local_10 = width_checker::operator()<char,_0>(&local_c9,bStack0000000000000008);
    bVar4 = arg;
    break;
  case 9:
    local_10 = width_checker::operator()<float,_0>(&local_c9,_bStack0000000000000008);
    bVar4 = arg;
    break;
  case 10:
    local_10 = width_checker::operator()<double,_0>
                         (&local_c9,(double)CONCAT44(in_stack_0000000c,_bStack0000000000000008));
    bVar4 = arg;
    break;
  case 0xb:
    local_10 = width_checker::operator()<long_double,_0>
                         (&local_c9,
                          (longdouble)
                          CONCAT28(arg.value_.field_0.int_value._0_2_,
                                   CONCAT44(in_stack_0000000c,_bStack0000000000000008)));
    bVar4 = arg;
    break;
  case 0xc:
    local_10 = width_checker::operator()<const_char_*,_0>
                         (&local_c9,(char *)CONCAT44(in_stack_0000000c,_bStack0000000000000008));
    bVar4 = arg;
    break;
  case 0xd:
    basic_string_view<char>::basic_string_view
              (&local_98,(char *)CONCAT44(in_stack_0000000c,_bStack0000000000000008),(size_t)this);
    bVar4 = arg;
    uVar1 = arg.value_.field_0.long_long_value._2_6_;
    uVar2 = arg.value_.field_0.int128_value._8_4_;
    arg = bVar4;
    bVar4 = arg;
    arg.value_.field_0.long_long_value._2_6_ = uVar1;
    arg.value_.field_0.int128_value._8_4_ = uVar2;
    local_10 = width_checker::operator()<fmt::v10::basic_string_view<char>,_0>(&local_c9,local_98);
    bVar4 = arg;
    break;
  case 0xe:
    local_10 = width_checker::operator()<const_void_*,_0>
                         (&local_c9,(void *)CONCAT44(in_stack_0000000c,_bStack0000000000000008));
    bVar4 = arg;
    break;
  case 0xf:
    custom.value._4_4_ = in_stack_0000000c;
    custom.value._0_4_ = _bStack0000000000000008;
    custom.format._0_2_ = arg.value_.field_0.int_value._0_2_;
    custom.format._2_6_ = arg.value_.field_0.long_long_value._2_6_;
    local_b0 = this;
    basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle::handle
              ((handle *)&local_a8,custom);
    bVar4 = arg;
    uVar1 = arg.value_.field_0.long_long_value._2_6_;
    uVar2 = arg.value_.field_0.int128_value._8_4_;
    arg = bVar4;
    bVar4 = arg;
    arg.value_.field_0.long_long_value._2_6_ = uVar1;
    arg.value_.field_0.int128_value._8_4_ = uVar2;
    local_10 = width_checker::
               operator()<fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle,_0>
                         (&local_c9,(handle)local_a8);
    bVar4 = arg;
  }
  arg = bVar4;
  uVar3 = local_10;
  uVar2 = arg.value_.field_0.int128_value._8_4_;
  uVar1 = arg.value_.field_0.long_long_value._2_6_;
  local_c8 = local_10;
  bVar4 = arg;
  arg.value_.field_0.long_long_value._2_6_ = uVar1;
  arg.value_.field_0.int128_value._8_4_ = uVar2;
  value_04 = max_value<int>();
  bVar4 = arg;
  uVar1 = arg.value_.field_0.long_long_value._2_6_;
  uVar2 = arg.value_.field_0.int128_value._8_4_;
  arg = bVar4;
  bVar4 = arg;
  arg.value_.field_0.long_long_value._2_6_ = uVar1;
  arg.value_.field_0.int128_value._8_4_ = uVar2;
  tVar5 = to_unsigned<int>(value_04);
  bVar4 = arg;
  if (uVar3 <= tVar5) {
    return (int)local_c8;
  }
  uVar1 = arg.value_.field_0.long_long_value._2_6_;
  uVar2 = arg.value_.field_0.int128_value._8_4_;
  arg = bVar4;
  bVar4 = arg;
  arg.value_.field_0.long_long_value._2_6_ = uVar1;
  arg.value_.field_0.int128_value._8_4_ = uVar2;
  throw_format_error("number is too big");
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg) -> int {
  unsigned long long value = visit_format_arg(Handler(), arg);
  if (value > to_unsigned(max_value<int>()))
    throw_format_error("number is too big");
  return static_cast<int>(value);
}